

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xbox.cpp
# Opt level: O3

void rw::xbox::defaultUninstanceCB(Geometry *geo,InstanceDataHeader *header)

{
  uint uVar1;
  uint32 *puVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  uint8 *puVar7;
  
  puVar2 = getVertexFmt(geo);
  uVar1 = *puVar2;
  puVar7 = (uint8 *)header->vertexBuffer;
  uVar5 = (ulong)(uVar1 & 0xf);
  uninstV3d(*(int *)(v3dFormatMap + uVar5 * 4),geo->morphTargets->vertices,puVar7,
            header->numVertices,header->stride);
  uVar3 = 4;
  if (uVar5 != 4) {
    uVar3 = (ulong)(uint)(*(int *)(vertexFormatSizes + uVar5 * 4) * 3);
  }
  puVar7 = puVar7 + uVar3;
  uVar4 = uVar1 >> 4 & 0xf;
  if (uVar4 != 0) {
    uninstV3d(*(int *)(v3dFormatMap + (ulong)uVar4 * 4),geo->morphTargets->normals,puVar7,
              header->numVertices,header->stride);
    uVar3 = 4;
    if (uVar4 != 4) {
      uVar3 = (ulong)(uint)(*(int *)(vertexFormatSizes + (ulong)uVar4 * 4) * 3);
    }
    puVar7 = puVar7 + uVar3;
  }
  if ((uVar1 >> 0x18 & 1) != 0) {
    uninstColor(10,geo->colors,puVar7,header->numVertices,header->stride);
    puVar7 = puVar7 + 4;
  }
  lVar6 = 0;
  do {
    uVar4 = uVar1 >> ((char)lVar6 + 8U & 0x1f) & 0xf;
    if (uVar4 == 0) {
      return;
    }
    uninstTexCoords(*(int *)(v2dFormatMap + (ulong)uVar4 * 4),
                    *(TexCoords **)((long)geo->texCoords + lVar6 * 2),puVar7,header->numVertices,
                    header->stride);
    uVar3 = 4;
    if (uVar4 != 4) {
      uVar3 = (ulong)(uint)(*(int *)(vertexFormatSizes + (ulong)uVar4 * 4) * 2);
    }
    puVar7 = puVar7 + uVar3;
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0x10);
  return;
}

Assistant:

void
defaultUninstanceCB(Geometry *geo, InstanceDataHeader *header)
{
	uint32 *vertexFmt = getVertexFmt(geo);
	uint32 fmt = *vertexFmt;
	assert(fmt != 0);
	uint8 *src = (uint8*)header->vertexBuffer;

	uint32 sel = fmt & 0xF;
	uninstV3d(v3dFormatMap[sel], geo->morphTargets[0].vertices, src,
	          header->numVertices, header->stride);
	src += sel == 4 ? 4 : 3*vertexFormatSizes[sel];

	sel = (fmt >> 4) & 0xF;
	if(sel){
		uninstV3d(v3dFormatMap[sel], geo->morphTargets[0].normals, src,
		          header->numVertices, header->stride);
		src += sel == 4 ? 4 : 3*vertexFormatSizes[sel];
	}

	if(fmt & 0x1000000){
		uninstColor(VERT_ARGB, geo->colors, src,
		            header->numVertices, header->stride);
		src += 4;
	}

	for(int i = 0; i < 4; i++){
		sel = (fmt >> (i*4 + 8)) & 0xF;
		if(sel == 0)
			break;
		uninstTexCoords(v2dFormatMap[sel], geo->texCoords[i], src,
		          header->numVertices, header->stride);
		src += sel == 4 ? 4 : 2*vertexFormatSizes[sel];
	}
}